

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

void rtosc::path_search(Ports *root,char *str,char *needle,char *types,size_t max_types,
                       rtosc_arg_t *args,size_t max_args,path_search_opts opts,bool reply_with_query
                       )

{
  pointer pPVar1;
  char *__s;
  char *__s2;
  long lVar2;
  rtosc_arg_t *prVar3;
  int iVar4;
  Port *pPVar5;
  size_t __n;
  size_t sVar6;
  my_array<rtosc_arg_t,_2UL> *__i;
  rtosc_arg_t *prVar7;
  Port *p_00;
  ulong uVar8;
  ulong uVar9;
  Port *p;
  pointer p_01;
  long lVar10;
  size_t max;
  anon_class_40_5_2428ddf5 fn;
  size_t local_b0;
  rtosc_arg_t *local_a8;
  long local_a0;
  char *local_98;
  ulong local_90;
  char *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  size_t local_60;
  anon_class_40_5_2428ddf5 local_58;
  
  local_98 = needle;
  if (needle == (char *)0x0) {
    local_98 = "";
  }
  uVar8 = max_types - 1;
  if (max_args <= max_types - 1) {
    uVar8 = max_args;
  }
  local_b0 = 0;
  local_a8 = args;
  local_88 = types;
  local_60 = uVar8;
  memset(types,0,uVar8 + 1);
  memset(args,0,uVar8);
  if (reply_with_query) {
    *types = 's';
    args->s = str;
    types[1] = 's';
    local_b0 = 2;
    args[1].s = local_98;
  }
  if ((*str == '\0') || (iVar4 = strcmp(str,"/"), iVar4 == 0)) {
    p_00 = (Port *)0x0;
  }
  else {
    pPVar5 = Ports::apropos(root,str);
    if (pPVar5 == (Port *)0x0) {
      root = (Ports *)0x0;
      p_00 = (Port *)0x0;
    }
    else {
      root = pPVar5->ports;
      p_00 = (Port *)0x0;
      if (root == (Ports *)0x0) {
        p_00 = pPVar5;
      }
    }
  }
  local_58.pos = &local_b0;
  local_58.needle = &local_98;
  local_58.types = &local_88;
  local_58.args = &local_a8;
  local_58.max = &local_60;
  if (root == (Ports *)0x0) {
    if (p_00 != (Port *)0x0) {
      path_search::anon_class_40_5_2428ddf5::operator()(&local_58,p_00);
    }
  }
  else {
    p_01 = (root->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
           super__Vector_impl_data._M_start;
    pPVar1 = (root->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (p_01 != pPVar1) {
      do {
        path_search::anon_class_40_5_2428ddf5::operator()(&local_58,p_01);
        p_01 = p_01 + 1;
      } while (p_01 != pPVar1);
    }
  }
  prVar3 = local_a8;
  sVar6 = local_b0;
  if (opts - sorted < 2) {
    uVar8 = local_b0 >> 1;
    uVar9 = uVar8 * 0x20;
    if (1 < local_b0) {
      prVar7 = local_a8 + uVar8 * 2;
      lVar10 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<my_array<rtosc_arg_t,2ul>*,long,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__1>>
                (local_a8,prVar7,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      if (uVar9 < 0x201) {
        std::
        __insertion_sort<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__1>>
                  (prVar3,prVar7);
      }
      else {
        prVar7 = prVar3 + 0x20;
        std::
        __insertion_sort<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__1>>
                  (prVar3,prVar7);
        if (uVar8 != 0x10) {
          lVar10 = uVar9 - 0x200;
          do {
            std::
            __unguarded_linear_insert<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Val_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__1>>
                      (prVar7);
            prVar7 = prVar7 + 2;
            lVar10 = lVar10 + -0x20;
          } while (lVar10 != 0);
        }
      }
    }
    if (opts == sorted_and_unique_prefix) {
      if (sVar6 < 4) {
        __n = 0;
      }
      else {
        __n = strlen(local_a8->s);
      }
      local_80 = sVar6;
      local_68 = sVar6 & 0xfffffffffffffffe;
      local_b0 = 2;
      local_78 = uVar9;
      local_70 = uVar8;
      if (local_68 < 3) {
        local_a0 = 0;
      }
      else {
        local_a0 = 0;
        uVar8 = 0;
        do {
          prVar3 = local_a8;
          sVar6 = local_b0;
          __s = local_a8[local_b0].s;
          local_90 = uVar8;
          uVar9 = strlen(__s);
          if (__n < uVar9) {
            __s2 = prVar3[local_90].s;
            iVar4 = strncmp(__s,__s2,__n);
            if ((iVar4 == 0) && (__s2[__n - 1] == '/')) {
              prVar3[sVar6].d = 0.0;
              local_a0 = local_a0 + 1;
              sVar6 = local_90;
              uVar9 = __n;
            }
          }
          local_b0 = local_b0 + 2;
          uVar8 = sVar6;
          __n = uVar9;
        } while (local_b0 < local_68);
      }
      uVar9 = local_70;
      uVar8 = local_78;
      prVar3 = local_a8;
      if (1 < local_80) {
        lVar10 = (long)local_a8 + local_78;
        lVar2 = 0x3f;
        if (local_70 != 0) {
          for (; local_70 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        std::
        __introsort_loop<my_array<rtosc_arg_t,2ul>*,long,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__2>>
                  (local_a8,lVar10,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
        if (uVar8 < 0x201) {
          std::
          __insertion_sort<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__2>>
                    (prVar3,lVar10);
        }
        else {
          prVar7 = prVar3 + 0x20;
          std::
          __insertion_sort<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__2>>
                    (prVar3,prVar7);
          if (uVar9 != 0x10) {
            lVar10 = uVar8 - 0x200;
            do {
              std::
              __unguarded_linear_insert<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Val_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__2>>
                        (prVar7);
              prVar7 = prVar7 + 2;
              lVar10 = lVar10 + -0x20;
            } while (lVar10 != 0);
          }
        }
      }
      local_88[(uVar9 - local_a0) * 2] = '\0';
    }
  }
  return;
}

Assistant:

void rtosc::path_search(const rtosc::Ports& root,
                        const char *str, const char* needle,
                        char *types, std::size_t max_types,
                        rtosc_arg_t* args, std::size_t max_args,
                        path_search_opts opts, bool reply_with_query)
{
    using rtosc::Ports;
    using rtosc::Port;

    if(!needle)
        needle = "";

    // the last char of "types" is being used for a terminating 0
    std::size_t  max         = std::min(max_types - 1, max_args);
    size_t       pos         = 0;
    const Ports *ports       = nullptr;
    const Port  *single_port = nullptr;

    //zero out data
    memset(types, 0, max + 1);
    memset(args,  0, max);

    if(reply_with_query) {
        assert(max >= 2);
        types[pos]    = 's';
        args[pos++].s = str;
        types[pos]    = 's';
        args[pos++].s = needle;
    }

    if(!*str || !strcmp(str, "/")) {
        ports = &root;
    } else {
        const Port *port = root.apropos(str);
        //fprintf(stderr, "apropos %s -> %s\n",str,port?port->name:"<no result>");
        if(port) {
            if(port->ports) {
                ports = port->ports;
            } else {
                single_port = port;
            }
        }
    }

    const auto fn = [&pos,&needle,&types,&args,&max](const Port& p)
    {
#ifdef NDEBUG
        (void)max;
#else
        assert(pos < max);
#endif
        //fprintf(stderr, "path search iterating port: %s (needle %s) (pos %d)\n", p.name, needle, (int)pos);
        if(p.name && strstr(p.name, needle) == p.name)
        {
            types[pos]    = 's';
            args[pos++].s = p.name;
            types[pos]    = 'b';
            if(p.metadata && *p.metadata) {
                args[pos].b.data = (unsigned char*) p.metadata;
                auto tmp = rtosc::Port::MetaContainer(p.metadata);
                args[pos++].b.len  = tmp.length();
            } else {
                args[pos].b.data = (unsigned char*) NULL;
                args[pos++].b.len  = 0;
            }
        }
    };

    if(ports)
        for(const Port &p:*ports) fn(p);
    else if(single_port)
        fn(*single_port);

    if (opts == path_search_opts::sorted ||
        opts == path_search_opts::sorted_and_unique_prefix)
    {
        // we could use std::array, but its internal array does not necessarily
        // have offset 0
        using val_on_2 = my_array<rtosc_arg_t, 2>;
        using ptr_on_2 = val_on_2*;
        auto is_less = [](const val_on_2 &p1, const val_on_2 &p2) -> bool {
            return strcmp(p1[0].s, p2[0].s) < 0;
        };
        std::size_t n_paths_found = pos >> 1;
        std::sort((ptr_on_2)args, ((ptr_on_2)(args))+n_paths_found, is_less);

        if (opts == path_search_opts::sorted_and_unique_prefix)
        {
            std::size_t prev_pos = 0;
            std::size_t strlen_prev = n_paths_found > 1 ? strlen(args[prev_pos].s) : 0;
            std::size_t unused_paths = 0;
            for(pos = 2; pos < (n_paths_found<<1); ++++pos)
            {
                assert(args[prev_pos].s); // invariant

                // is the prev path a (real) sub-path of this path?
                // i.e. the current can be accessed by recursing into the prev?
                if(strlen_prev < strlen(args[pos].s) &&
                   0 == strncmp(args[pos].s, args[prev_pos].s, strlen_prev) &&
                   args[prev_pos].s[strlen_prev-1] == '/')
                {
                    // then mark this as unused
                    args[pos].s = nullptr;
                    ++unused_paths;
                }
                else
                {
                    prev_pos = pos;
                    strlen_prev = strlen(args[prev_pos].s);
                }
            }

            // another sort, only to move unused paths to the end
            auto is_less_2 = [](const val_on_2 &p1, const val_on_2 &p2) -> bool {
                return (!(p1[0].s)) ? false // move p1 to the end
                                    : (!(p2[0].s)) ? true // move p2 to the end
                                                   // is actually already sorted:
                                                   : (strcmp(p1[0].s, p2[0].s) < 0);
            };
            std::sort((ptr_on_2)args, ((ptr_on_2)(args))+n_paths_found, is_less_2);

            // cut off unused paths
            types[(n_paths_found - unused_paths)<<1] = 0;
        }
    }
}